

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O2

int ffccls(fitsfile *infptr,fitsfile *outfptr,int incol,int outcol,int ncols,int create_col,
          int *status)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  int tstatus;
  uint uStack_17d78;
  int iStack_17d74;
  ulong uStack_17d70;
  ulong uStack_17d68;
  int typecode;
  ulong uStack_17d58;
  long lStack_17d50;
  ulong uStack_17d48;
  char (*pacStack_17d40) [81];
  long orepeat;
  long repeat;
  long tfields;
  int otypecode;
  long owidth;
  long width;
  char keyname [75];
  char tform [71];
  char ttype [71];
  char tform_comm [73];
  char ttype_comm [73];
  char *tforms [1000];
  char *ttypes [1000];
  char keyarr [1001] [81];
  
  if (0 < *status) {
    return *status;
  }
  if (1000 < ncols) {
    *status = 0x6f;
    return 0x6f;
  }
  iStack_17d74 = outcol;
  uStack_17d78 = incol;
  if (infptr->HDUposition == infptr->Fptr->curhdu) {
    if (infptr->Fptr->datastart == -1) {
      ffrdef(infptr,status);
    }
  }
  else {
    ffmahd(infptr,infptr->HDUposition + 1,(int *)0x0,status);
  }
  iVar1 = infptr->Fptr->hdutype;
  if (outfptr->HDUposition == outfptr->Fptr->curhdu) {
    if (outfptr->Fptr->datastart == -1) {
      ffrdef(outfptr,status);
    }
  }
  else {
    ffmahd(outfptr,outfptr->HDUposition + 1,(int *)0x0,status);
  }
  if (0 < *status) {
    return *status;
  }
  iVar2 = outfptr->Fptr->hdutype;
  if (iVar2 == 0 || iVar1 == 0) {
    ffpmsg("Can not copy columns to or from IMAGE HDUs (ffccls)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((iVar2 == 1 && iVar1 == 2) || (iVar2 == 2 && iVar1 == 1)) {
    pcVar6 = "Copying between Binary and ASCII tables is not supported (ffccls)";
LAB_0013e53f:
    ffpmsg(pcVar6);
    *status = 0xe3;
    return 0xe3;
  }
  if ((infptr->Fptr == outfptr->Fptr) && (infptr->HDUposition == outfptr->HDUposition)) {
    pcVar6 = "Copying multiple columns in same HDU is not supported (ffccls)";
    goto LAB_0013e53f;
  }
  tstatus = 0;
  iVar1 = ffgkyj(outfptr,"TFIELDS",&tfields,(char *)0x0,&tstatus);
  if (iVar1 != 0) {
    ffpmsg("Could not read TFIELDS keyword in output table (ffccls)");
    *status = 0xe6;
    return 0xe6;
  }
  iVar1 = (int)tfields + 1;
  lVar4 = (long)iStack_17d74;
  if (iVar1 < iStack_17d74) {
    iStack_17d74 = iVar1;
  }
  uStack_17d68 = 0;
  if (0 < ncols) {
    uStack_17d68 = (ulong)(uint)ncols;
  }
  lStack_17d50 = (long)iVar1;
  if (lVar4 < iVar1) {
    lStack_17d50 = lVar4;
  }
  uStack_17d48 = (ulong)uStack_17d78;
  uVar3 = 0;
  for (uVar5 = 0; iVar1 = iStack_17d74, uStack_17d68 != uVar5; uVar5 = uVar5 + 1) {
    iVar1 = (int)uVar5 + (int)uStack_17d48;
    uStack_17d70 = uVar3;
    uStack_17d58 = uVar5;
    ffgtcl(infptr,iVar1,&typecode,&repeat,&width,status);
    if (typecode < 0) {
      pcVar6 = "Variable-length columns are not supported (ffccls)";
LAB_0013e7f5:
      ffpmsg(pcVar6);
      *status = 0x105;
      return 0x105;
    }
    tstatus = 0;
    ffkeyn("TTYPE",iVar1,keyname,&tstatus);
    ffgkys(infptr,keyname,ttype,ttype_comm,&tstatus);
    ffkeyn("TFORM",iVar1,keyname,&tstatus);
    iVar1 = ffgkys(infptr,keyname,tform,tform_comm,&tstatus);
    uVar5 = uStack_17d58;
    if (iVar1 != 0) {
      ffpmsg("Could not find TTYPE and TFORM keywords in input table (ffccls)");
      *status = 0xe8;
      return 0xe8;
    }
    if (create_col == 0) {
      ffgtcl(outfptr,(int)lStack_17d50 + (int)uStack_17d58,&otypecode,&orepeat,&owidth,status);
      if (orepeat != repeat) {
        pcVar6 = "Input and output vector columns must have same length (ffccls)";
        goto LAB_0013e7f5;
      }
    }
    else {
      iVar1 = (int)uStack_17d70;
      tforms[uStack_17d58] = keyarr[iVar1];
      uStack_17d70 = (ulong)(iVar1 + 2);
      pacStack_17d40 = keyarr + (iVar1 + 1);
      ttypes[uStack_17d58] = *pacStack_17d40;
      strcpy(keyarr[iVar1],tform);
      strcpy(*pacStack_17d40,ttype);
    }
    uVar3 = uStack_17d70;
  }
  if (create_col != 0) {
    iVar2 = fficls(outfptr,iStack_17d74,ncols,ttypes,tforms,status);
    uVar5 = uStack_17d68;
    uVar7 = uStack_17d78;
    if (0 < iVar2) {
      ffpmsg("Could not append new columns to output file (ffccls)");
      goto LAB_0013eac0;
    }
    while ((int)uVar5 != 0) {
      uStack_17d70 = CONCAT44(uStack_17d70._4_4_,(int)uVar5 + -1);
      ffkeyn("TTYPE",uVar7,keyname,status);
      ffgkys(infptr,keyname,ttype,ttype_comm,status);
      ffkeyn("TTYPE",iVar1,keyname,status);
      ffmcom(outfptr,keyname,ttype_comm,status);
      ffkeyn("TFORM",uVar7,keyname,status);
      ffgkys(infptr,keyname,tform,tform_comm,status);
      ffkeyn("TFORM",iVar1,keyname,status);
      ffmcom(outfptr,keyname,tform_comm,status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TUNIT",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TSCAL",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TZERO",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TDISP",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TLMIN",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TLMAX",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TDIM",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCTYP",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCUNI",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCRVL",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCRPX",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCDLT",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TCROT",status);
      ffcpky(infptr,outfptr,uVar7,iVar1,"TNULL",status);
      iVar1 = iVar1 + 1;
      uVar7 = uVar7 + 1;
      uVar5 = uStack_17d70 & 0xffffffff;
    }
    iVar2 = ffrdef(outfptr,status);
    iVar1 = iStack_17d74;
    if (iVar2 != 0) goto LAB_0013eac0;
  }
  while (uVar7 = uStack_17d78, iVar2 = (int)uStack_17d68, uStack_17d68 = (ulong)(iVar2 - 1),
        iVar2 != 0) {
    ffcpcl(infptr,outfptr,uStack_17d78,iVar1,0,status);
    uStack_17d78 = uVar7 + 1;
    iVar1 = iVar1 + 1;
  }
LAB_0013eac0:
  return *status;
}

Assistant:

int ffccls(fitsfile *infptr,    /* I - FITS file pointer to input file  */
           fitsfile *outfptr,   /* I - FITS file pointer to output file */
           int incol,           /* I - number of first input column   */
           int outcol,          /* I - number for first output column  */
	   int ncols,           /* I - number of columns to copy from input to output */
           int create_col,      /* I - create new col if TRUE, else overwrite */
           int *status)         /* IO - error status     */
/*
  copy multiple columns from infptr and insert them in the outfptr
  table.  Optimized for multiple-column case since it only expands the
  output file once using fits_insert_cols() instead of calling
  fits_insert_col() multiple times.
*/
{
    int tstatus, colnum, typecode, otypecode, anynull;
    int inHduType, outHduType;
    long tfields, repeat, orepeat, width, owidth, nrows, outrows;
    long inloop, outloop, maxloop, ndone, ntodo, npixels;
    long firstrow, firstelem, ii;
    char keyname[FLEN_KEYWORD], ttype[FLEN_VALUE], tform[FLEN_VALUE];
    char ttype_comm[FLEN_COMMENT],tform_comm[FLEN_COMMENT];
    char *lvalues = 0, nullflag, **strarray = 0;
    char nulstr[] = {'\5', '\0'};  /* unique null string value */
    double dnull = 0.l, *dvalues = 0;
    float fnull = 0., *fvalues = 0;
    int typecodes[1000];
    char *ttypes[1000], *tforms[1000], keyarr[1001][FLEN_CARD];
    int ikey = 0;
    int icol, incol1, outcol1;

    if (*status > 0)
        return(*status);

    /* Do not allow more than internal array limit to be copied */
    if (ncols > 1000) return (*status = ARRAY_TOO_BIG);

    if (infptr->HDUposition != (infptr->Fptr)->curhdu)
    {
        ffmahd(infptr, (infptr->HDUposition) + 1, NULL, status);
    }
    else if ((infptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(infptr, status);                /* rescan header */
    inHduType = (infptr->Fptr)->hdutype;
    
    if (outfptr->HDUposition != (outfptr->Fptr)->curhdu)
    {
        ffmahd(outfptr, (outfptr->HDUposition) + 1, NULL, status);
    }
    else if ((outfptr->Fptr)->datastart == DATA_UNDEFINED)
        ffrdef(outfptr, status);               /* rescan header */
    outHduType = (outfptr->Fptr)->hdutype;
    
    if (*status > 0)
        return(*status);

    if (inHduType == IMAGE_HDU || outHduType == IMAGE_HDU)
    {
       ffpmsg
       ("Can not copy columns to or from IMAGE HDUs (ffccls)");
       return(*status = NOT_TABLE);
    }

    if ( (inHduType == BINARY_TBL &&  outHduType == ASCII_TBL) ||
	 (inHduType == ASCII_TBL  &&  outHduType == BINARY_TBL) )
    {
       ffpmsg
       ("Copying between Binary and ASCII tables is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Do not allow copying multiple columns in the same HDU because the
       permutations of possible overlapping copies is mind-bending */
    if ((infptr->Fptr == outfptr->Fptr)
	&& (infptr->HDUposition == outfptr->HDUposition))
    {
       ffpmsg
       ("Copying multiple columns in same HDU is not supported (ffccls)");
       return(*status = NOT_BTABLE);
    }

    /* Retrieve the number of columns in output file */
    tstatus=0;
    if (ffgkyj(outfptr, "TFIELDS", &tfields, 0, &tstatus))
    {
      ffpmsg
	("Could not read TFIELDS keyword in output table (ffccls)");
      return(*status = NO_TFIELDS);
    }

    colnum = minvalue((int) tfields + 1, outcol); /* output col. number */

    /* Collect data about input column (type, repeat, etc) */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffgtcl(infptr, incol1, &typecode, &repeat, &width, status);

      if (typecode < 0)
	{
	  ffpmsg("Variable-length columns are not supported (ffccls)");
	  return(*status = BAD_TFORM);
	}

      typecodes[icol] = typecode;

      tstatus = 0;
      ffkeyn("TTYPE", incol1, keyname, &tstatus);
      ffgkys(infptr, keyname, ttype, ttype_comm, &tstatus);

      ffkeyn("TFORM", incol1, keyname, &tstatus);
    
      if (ffgkys(infptr, keyname, tform, tform_comm, &tstatus) )
        {
          ffpmsg
	    ("Could not find TTYPE and TFORM keywords in input table (ffccls)");
          return(*status = NO_TFORM);
        }

      /* If creating columns, we need to save these values */
      if ( create_col ) {
	tforms[icol] = keyarr[ikey++];
	ttypes[icol] = keyarr[ikey++];

	strcpy(tforms[icol], tform);
	strcpy(ttypes[icol], ttype);
      } else {
	/* If not creating columns, then check the datatype and vector
	   repeat length of the output column */
        ffgtcl(outfptr, outcol1, &otypecode, &orepeat, &owidth, status);

        if (orepeat != repeat) {
            ffpmsg("Input and output vector columns must have same length (ffccls)");
            return(*status = BAD_TFORM);
        }
      }
    }

    /* Insert columns into output file and copy all meta-data
       keywords, if requested */
    if (create_col)
    {
        /* create the empty columns */
        if (fficls(outfptr, colnum, ncols, ttypes, tforms, status) > 0)
        {
           ffpmsg
           ("Could not append new columns to output file (ffccls)");
           return(*status);
        }

	/* Copy meta-data strings from input column to output */
	for (incol1 = incol, outcol1 = colnum, icol = 0; 
	     icol < ncols; 
	     icol++, incol1++, outcol1++)
	{
	  /* copy the comment strings from the input file for TTYPE and TFORM */
	  ffkeyn("TTYPE", incol1, keyname, status);
	  ffgkys(infptr, keyname, ttype, ttype_comm, status);
	  ffkeyn("TTYPE", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, ttype_comm, status);
	  
	  ffkeyn("TFORM", incol1, keyname, status);
	  ffgkys(infptr, keyname, tform, tform_comm, status);
	  ffkeyn("TFORM", outcol1, keyname, status);
	  ffmcom(outfptr, keyname, tform_comm, status);
	  
	  /* copy other column-related keywords if they exist */
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TUNIT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TSCAL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TZERO", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDISP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMIN", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TLMAX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TDIM", status);

	  /*  WCS keywords */
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCTYP", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCUNI", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRVL", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCRPX", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCDLT", status);
	  ffcpky(infptr, outfptr, incol1, outcol1, "TCROT", status);
	  
	  ffcpky(infptr, outfptr, incol1, outcol1, "TNULL", status);

	}

	/* rescan header to recognize the new keywords */
	if (ffrdef(outfptr, status) )
	  return(*status);
    }
	
    /* Copy columns using standard ffcpcl(); do this in a loop because
       the I/O-intensive column expanding is done */
    for (incol1 = incol, outcol1 = colnum, icol = 0; 
	 icol < ncols; 
	 icol++, incol1++, outcol1++)
    {
      ffcpcl(infptr, outfptr, incol1, outcol1, 0, status);
    }

    return(*status);
}